

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void __thiscall pybind11::detail::instance::allocate_layout(instance *this)

{
  PyTypeObject *t;
  byte bVar1;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var2;
  long lVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  long *plVar6;
  PyTypeObject *unaff_RBX;
  long lVar7;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar8;
  
  t = (this->ob_base).ob_type;
  pVar8 = all_type_info_get_cache(unaff_RBX);
  _Var2 = pVar8.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)((long)_Var2.
                           super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                           ._M_cur + 0x10));
  }
  lVar3 = *(long *)((long)_Var2.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x18) -
          (long)*(long **)((long)_Var2.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x10) >> 3;
  if (lVar3 == 1) {
    if (*(ulong *)(**(long **)((long)_Var2.
                                     super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                     ._M_cur + 0x10) + 0x20) < 3) {
      (this->field_1).simple_value_holder[0] = (void *)0x0;
      bVar1 = this->field_0x30 & 0xf1 | 2;
      goto LAB_0011366b;
    }
  }
  else if (lVar3 == 0) {
    pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");
  }
  this->field_0x30 = this->field_0x30 & 0xfd;
  lVar7 = 0;
  for (plVar6 = *(long **)((long)_Var2.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x10);
      plVar6 != *(long **)((long)_Var2.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x18); plVar6 = plVar6 + 1) {
    lVar7 = lVar7 + *(long *)(*plVar6 + 0x20) + 1;
  }
  ppvVar4 = (void **)PyMem_Calloc((lVar3 - 1U >> 3) + lVar7 + 1,8);
  (this->field_1).nonsimple.values_and_holders = ppvVar4;
  if (ppvVar4 == (void **)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = Neyn::Server::Server;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  (this->field_1).simple_value_holder[1] = ppvVar4 + lVar7;
  bVar1 = this->field_0x30;
LAB_0011366b:
  this->field_0x30 = bVar1 | 1;
  return;
}

Assistant:

PYBIND11_NOINLINE inline void instance::allocate_layout() {
    auto &tinfo = all_type_info(Py_TYPE(this));

    const size_t n_types = tinfo.size();

    if (n_types == 0)
        pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");

    simple_layout =
        n_types == 1 && tinfo.front()->holder_size_in_ptrs <= instance_simple_holder_in_ptrs();

    // Simple path: no python-side multiple inheritance, and a small-enough holder
    if (simple_layout) {
        simple_value_holder[0] = nullptr;
        simple_holder_constructed = false;
        simple_instance_registered = false;
    }
    else { // multiple base types or a too-large holder
        // Allocate space to hold: [v1*][h1][v2*][h2]...[bb...] where [vN*] is a value pointer,
        // [hN] is the (uninitialized) holder instance for value N, and [bb...] is a set of bool
        // values that tracks whether each associated holder has been initialized.  Each [block] is
        // padded, if necessary, to an integer multiple of sizeof(void *).
        size_t space = 0;
        for (auto t : tinfo) {
            space += 1; // value pointer
            space += t->holder_size_in_ptrs; // holder instance
        }
        size_t flags_at = space;
        space += size_in_ptrs(n_types); // status bytes (holder_constructed and instance_registered)

        // Allocate space for flags, values, and holders, and initialize it to 0 (flags and values,
        // in particular, need to be 0).  Use Python's memory allocation functions: in Python 3.6
        // they default to using pymalloc, which is designed to be efficient for small allocations
        // like the one we're doing here; in earlier versions (and for larger allocations) they are
        // just wrappers around malloc.
#if PY_VERSION_HEX >= 0x03050000
        nonsimple.values_and_holders = (void **) PyMem_Calloc(space, sizeof(void *));
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
#else
        nonsimple.values_and_holders = (void **) PyMem_New(void *, space);
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
        std::memset(nonsimple.values_and_holders, 0, space * sizeof(void *));
#endif
        nonsimple.status = reinterpret_cast<uint8_t *>(&nonsimple.values_and_holders[flags_at]);
    }
    owned = true;
}